

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.c
# Opt level: O1

void zxscreen_convert(void *vscr,uint *poutput,zxbox_t *dirty)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  uint *puVar11;
  
  uVar9 = dirty->x0;
  uVar8 = uVar9 >> 5;
  if ((int)uVar9 < 1) {
    uVar8 = 0;
  }
  uVar3 = 7;
  if ((int)uVar9 < 0xff) {
    uVar3 = uVar8;
  }
  iVar7 = 0;
  if (0 < dirty->y0) {
    iVar7 = dirty->y0;
  }
  if (0xbe < iVar7) {
    iVar7 = 0xbf;
  }
  iVar4 = dirty->x1;
  uVar9 = 1;
  if (0xff < iVar4) {
    uVar9 = 8;
  }
  uVar8 = iVar4 + 0x1fU >> 5;
  if (iVar4 - 0x100U < 0xffffff02) {
    uVar8 = uVar9;
  }
  iVar4 = 1;
  if (1 < dirty->y1) {
    iVar4 = dirty->y1;
  }
  if (0xbf < iVar4) {
    iVar4 = 0xc0;
  }
  if (iVar7 < iVar4) {
    uVar9 = 0xc0 - iVar4;
    iVar4 = uVar8 - uVar3;
    puVar6 = poutput + (uVar3 * 0x20 + uVar9 * 0x100);
    puVar11 = (uint *)((long)vscr + (ulong)((uVar9 & 0xfffffff8) + uVar3) * 4 + 0x1800);
    do {
      if (0 < iVar4) {
        puVar10 = (uint *)((long)vscr +
                          (ulong)(uVar3 + ((((uVar9 >> 3 ^ uVar9) & 7) * 9 ^ uVar9) & 0x7ffffff) * 8
                                 ) * 4);
        iVar5 = iVar4 + 1;
        do {
          uVar8 = *puVar10;
          uVar2 = *puVar11;
          bVar1 = ""[uVar2 & 0x7f];
          *puVar6 = *(uint *)((long)palette + (ulong)(uVar8 >> 5 & 4) + (ulong)bVar1 * 4);
          puVar6[1] = *(uint *)((long)palette + (ulong)(uVar8 >> 4 & 4) + (ulong)bVar1 * 4);
          puVar6[2] = *(uint *)((long)palette + (ulong)(uVar8 >> 3 & 4) + (ulong)bVar1 * 4);
          puVar6[3] = *(uint *)((long)palette + (ulong)(uVar8 >> 2 & 4) + (ulong)bVar1 * 4);
          puVar6[4] = *(uint *)((long)palette + (ulong)(uVar8 >> 1 & 4) + (ulong)bVar1 * 4);
          puVar6[5] = *(uint *)((long)palette + (ulong)(uVar8 & 4) + (ulong)bVar1 * 4);
          puVar6[6] = *(uint *)((long)palette + (ulong)(uVar8 & 2) * 2 + (ulong)bVar1 * 4);
          puVar6[7] = palette[(ulong)bVar1 + (ulong)(uVar8 & 1)];
          bVar1 = ""[uVar2 >> 8 & 0x7f];
          puVar6[8] = *(uint *)((long)palette + (ulong)(uVar8 >> 0xd & 4) + (ulong)bVar1 * 4);
          puVar6[9] = *(uint *)((long)palette + (ulong)(uVar8 >> 0xc & 4) + (ulong)bVar1 * 4);
          puVar6[10] = *(uint *)((long)palette + (ulong)(uVar8 >> 0xb & 4) + (ulong)bVar1 * 4);
          puVar6[0xb] = *(uint *)((long)palette + (ulong)(uVar8 >> 10 & 4) + (ulong)bVar1 * 4);
          puVar6[0xc] = *(uint *)((long)palette + (ulong)(uVar8 >> 9 & 4) + (ulong)bVar1 * 4);
          puVar6[0xd] = *(uint *)((long)palette + (ulong)(uVar8 >> 8 & 4) + (ulong)bVar1 * 4);
          puVar6[0xe] = *(uint *)((long)palette + (ulong)(uVar8 >> 7 & 4) + (ulong)bVar1 * 4);
          puVar6[0xf] = *(uint *)((long)palette + (ulong)(uVar8 >> 6 & 4) + (ulong)bVar1 * 4);
          bVar1 = ""[uVar2 >> 0x10 & 0x7f];
          puVar6[0x10] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x15 & 4) + (ulong)bVar1 * 4);
          puVar6[0x11] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x14 & 4) + (ulong)bVar1 * 4);
          puVar6[0x12] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x13 & 4) + (ulong)bVar1 * 4);
          puVar6[0x13] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x12 & 4) + (ulong)bVar1 * 4);
          puVar6[0x14] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x11 & 4) + (ulong)bVar1 * 4);
          puVar6[0x15] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x10 & 4) + (ulong)bVar1 * 4);
          puVar6[0x16] = *(uint *)((long)palette + (ulong)(uVar8 >> 0xf & 4) + (ulong)bVar1 * 4);
          puVar6[0x17] = *(uint *)((long)palette + (ulong)(uVar8 >> 0xe & 4) + (ulong)bVar1 * 4);
          bVar1 = ""[uVar2 >> 0x18 & 0x7f];
          puVar6[0x18] = palette[(ulong)bVar1 + (ulong)(uVar8 >> 0x1f)];
          puVar6[0x19] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x1c & 4) + (ulong)bVar1 * 4);
          puVar6[0x1a] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x1b & 4) + (ulong)bVar1 * 4);
          puVar6[0x1b] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x1a & 4) + (ulong)bVar1 * 4);
          puVar10 = puVar10 + 1;
          puVar6[0x1c] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x19 & 4) + (ulong)bVar1 * 4);
          puVar6[0x1d] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x18 & 4) + (ulong)bVar1 * 4);
          puVar6[0x1e] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x17 & 4) + (ulong)bVar1 * 4);
          puVar11 = puVar11 + 1;
          puVar6[0x1f] = *(uint *)((long)palette + (ulong)(uVar8 >> 0x16 & 4) + (ulong)bVar1 * 4);
          puVar6 = puVar6 + 0x20;
          iVar5 = iVar5 + -1;
        } while (1 < iVar5);
      }
      puVar6 = puVar6 + (iVar4 * -0x20 + 0x100);
      puVar11 = puVar11 + (long)(8 - iVar4) + (ulong)((~uVar9 & 7) == 0) * 8 + -8;
      uVar9 = uVar9 + 1;
    } while (uVar9 < 0xc0U - iVar7);
  }
  return;
}

Assistant:

void zxscreen_convert(const void    *vscr,
                      unsigned int  *poutput,
                      const zxbox_t *dirty)
{
  zxbox_t              box;
  int                  height;
  const unsigned int  *pattrs;
  int                  width;
  int                  x,linear_y;
  const unsigned int  *pinput;
  unsigned int         input;
  unsigned int         attrs;
  const unsigned int  *pal;

  assert(dirty);

#ifdef SHOW_DIRTY_RECTS
  static int dirtybits;
  dirtybits = 0x20202020 - dirtybits;
#endif

  /* Clamp the dirty rectangle to the screen dimensions. */
  box.x0 = CLAMP(dirty->x0, 0, 255);
  box.y0 = CLAMP(dirty->y0, 0, 191);
  box.x1 = CLAMP(dirty->x1, 1, 256);
  box.y1 = CLAMP(dirty->y1, 1, 192);

  /* The inner loop processes 32 pixels at a time, so we need to convert x
   * coordinates into chunks four attributes wide while rounding up and down as
   * required. */
  box.x0 = (box.x0     ) / 32; /* divide to 0..7 rounding down */
  box.x1 = (box.x1 + 31) / 32; /* divide to 0..7 rounding up */

  /* Convert y coordinates into screen space - (0,0) is top left. */
  height = box.y1 - box.y0;
  box.y0 = 192 - box.y1;
  box.y1 = box.y0 + height;

  pattrs = (const unsigned int *) vscr
         + (SCREEN_BITMAP_LENGTH
         + box.y0 / 8 * 32  /* 8 scanlines/row, 32 attrs/row */
         + box.x0 * 4) / 4; /* 4 bytes/chunk, 4 bytes/word */

  poutput += box.y0 * 256 /* 256 pixels/row (256 words) for output */
           + box.x0 * 32; /* 32 pixels/chunk (32 words) */

  width = box.x1 - box.x0; /* hoisted out of loop */

  for (linear_y = box.y0; linear_y < box.y1; linear_y++)
  {
    /* Transpose fields using XOR */
    unsigned int tmp = (linear_y ^ (linear_y >> 3)) & 7;
    int          y   = linear_y ^ (tmp | (tmp << 3));

    pinput = (const unsigned int *) vscr
           + (y     * 32           /* 32 bytes/row */
           + box.x0 * 32 / 8) / 4; /* 32 bytes/row, 8 pixels/byte, 4 bytes/word */
    for (x = width; x > 0; x--) /* x is unused in the loop body */
    {
      input = *pinput++;
      attrs = *pattrs++;
#ifdef SHOW_DIRTY_RECTS
      attrs ^= dirtybits; /* force colour attrs to show redrawn areas */
#endif

      WRITE8PIX(0);
      WRITE8PIX(8);
      WRITE8PIX(16);
      WRITE8PIX(24);
    }

    /* Skip to the start of the next row. */
    pattrs  += 8   - width;
    poutput += 256 - width * 32;

    /* Rewind pattrs except at the end of an attribute row. */
    if ((linear_y & 7) != 7)
      pattrs -= 8;
  }
}